

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_const_value.h
# Opt level: O0

int64_t __thiscall t_const_value::get_integer(t_const_value *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  t_enum_value *local_b8;
  t_enum_value *val;
  long local_90;
  size_type dot;
  string identifier;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  t_const_value *local_18;
  t_const_value *this_local;
  
  if (this->valType_ == CV_IDENTIFIER) {
    local_18 = this;
    if (this->enum_ == (t_enum *)0x0) {
      identifier.field_2._M_local_buf[0xb] = '\x01';
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      get_identifier_abi_cxx11_(&local_58,this);
      std::operator+(&local_38,"have identifier \"",&local_58);
      std::operator+(pbVar2,&local_38,"\", but unset enum on line!");
      identifier.field_2._M_local_buf[0xb] = '\0';
      __cxa_throw(pbVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    get_identifier_abi_cxx11_((string *)&dot,this);
    local_90 = std::__cxx11::string::rfind((char)&dot,0x2e);
    if (local_90 != -1) {
      std::__cxx11::string::substr((ulong)&val,(ulong)&dot);
      std::__cxx11::string::operator=((string *)&dot,(string *)&val);
      std::__cxx11::string::~string((string *)&val);
    }
    local_b8 = t_enum::get_constant_by_name(this->enum_,(string *)&dot);
    if (local_b8 == (t_enum_value *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::operator+(&local_118,"Unable to find enum value \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dot);
      std::operator+(&local_f8,&local_118,"\" in enum \"");
      iVar1 = (*(this->enum_->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar1));
      std::operator+(pbVar2,&local_d8,"\"");
      __cxa_throw(pbVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    iVar1 = t_enum_value::get_value(local_b8);
    this_local = (t_const_value *)(long)iVar1;
    std::__cxx11::string::~string((string *)&dot);
  }
  else {
    this_local = (t_const_value *)this->intVal_;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t get_integer() const {
    if (valType_ == CV_IDENTIFIER) {
      if (enum_ == nullptr) {
        throw "have identifier \"" + get_identifier() + "\", but unset enum on line!";
      }
      std::string identifier = get_identifier();
      std::string::size_type dot = identifier.rfind('.');
      if (dot != std::string::npos) {
        identifier = identifier.substr(dot + 1);
      }
      t_enum_value* val = enum_->get_constant_by_name(identifier);
      if (val == nullptr) {
        throw "Unable to find enum value \"" + identifier + "\" in enum \"" + enum_->get_name()
            + "\"";
      }
      return val->get_value();
    } else {
      return intVal_;
    }
  }